

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLAES.cpp
# Opt level: O3

EVP_CIPHER * __thiscall OSSLAES::getWrapCipher(OSSLAES *this,Type mode,SymmetricKey *key)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar2;
  EVP_CIPHER *pEVar3;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_02;
  
  if (key != (SymmetricKey *)0x0) {
    iVar1 = (*(key->super_Serialisable)._vptr_Serialisable[7])(key);
    if (((CONCAT44(extraout_var,iVar1) != 0x80) &&
        (iVar1 = (*(key->super_Serialisable)._vptr_Serialisable[7])(key),
        CONCAT44(extraout_var_00,iVar1) != 0xc0)) &&
       (iVar1 = (*(key->super_Serialisable)._vptr_Serialisable[7])(key),
       CONCAT44(extraout_var_01,iVar1) != 0x100)) {
      iVar1 = (*(key->super_Serialisable)._vptr_Serialisable[7])(key);
      softHSMLog(3,"getWrapCipher",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLAES.cpp"
                 ,100,"Invalid AES key length (%d bits)",CONCAT44(extraout_var_04,iVar1));
      return (EVP_CIPHER *)0x0;
    }
    if (mode == AES_KEYWRAP_PAD) {
      iVar1 = (*(key->super_Serialisable)._vptr_Serialisable[7])(key);
      lVar2 = CONCAT44(extraout_var_03,iVar1);
      if (lVar2 == 0x100) {
        pEVar3 = (EVP_CIPHER *)EVP_aes_256_wrap_pad();
        return pEVar3;
      }
      if (lVar2 == 0xc0) {
        pEVar3 = (EVP_CIPHER *)EVP_aes_192_wrap_pad();
        return pEVar3;
      }
      if (lVar2 == 0x80) {
        pEVar3 = (EVP_CIPHER *)EVP_aes_128_wrap_pad();
        return pEVar3;
      }
    }
    else if (mode == AES_KEYWRAP) {
      iVar1 = (*(key->super_Serialisable)._vptr_Serialisable[7])(key);
      lVar2 = CONCAT44(extraout_var_02,iVar1);
      if (lVar2 == 0x100) {
        pEVar3 = (EVP_CIPHER *)EVP_aes_256_wrap();
        return pEVar3;
      }
      if (lVar2 == 0xc0) {
        pEVar3 = (EVP_CIPHER *)EVP_aes_192_wrap();
        return pEVar3;
      }
      if (lVar2 == 0x80) {
        pEVar3 = (EVP_CIPHER *)EVP_aes_128_wrap();
        return pEVar3;
      }
    }
    softHSMLog(3,"getWrapCipher",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLAES.cpp"
               ,0x89,"unknown AES key wrap mode %i",mode);
  }
  return (EVP_CIPHER *)0x0;
}

Assistant:

const EVP_CIPHER* OSSLAES::getWrapCipher(const SymWrap::Type mode, const SymmetricKey* key) const
{
	if (key == NULL)
		return NULL;

	// Check currentKey bit length; AES only supports 128, 192 or 256 bit keys
	if ((key->getBitLen() != 128) &&
	    (key->getBitLen() != 192) &&
	    (key->getBitLen() != 256))
	{
		ERROR_MSG("Invalid AES key length (%d bits)", key->getBitLen());

		return NULL;
	}

#ifdef HAVE_AES_KEY_WRAP
	// Determine the un/wrapping mode
	if (mode == SymWrap::AES_KEYWRAP)
	{
		// RFC 3394 AES key wrap
		switch(key->getBitLen())
		{
			case 128:
				return EVP_aes_128_wrap();
			case 192:
				return EVP_aes_192_wrap();
			case 256:
				return EVP_aes_256_wrap();
		};
	}
#endif
#ifdef HAVE_AES_KEY_WRAP_PAD
	if (mode == SymWrap::AES_KEYWRAP_PAD)
	{
		// RFC 5649 AES key wrap with pad
		switch(key->getBitLen())
		{
			case 128:
				return EVP_aes_128_wrap_pad();
			case 192:
				return EVP_aes_192_wrap_pad();
			case 256:
				return EVP_aes_256_wrap_pad();
		};
	}
#endif

	ERROR_MSG("unknown AES key wrap mode %i", mode);
	return NULL;
}